

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O3

void ResizeCountNodePages(void)

{
  size_t __size;
  int iVar1;
  int **__ptr;
  int iVar2;
  int **__ptr_00;
  int **ppiVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  iVar1 = page;
  lVar6 = (long)page;
  uVar5 = page + 1;
  __ptr_00 = nodePages;
  page = uVar5;
  ppiVar3 = lightNodePages;
  iVar2 = maxPages;
  if (uVar5 == maxPages) {
    __size = lVar6 * 8 + 0x408;
    __ptr_00 = (int **)malloc(__size);
    ppiVar3 = nodePages;
    if (__ptr_00 == (int **)0x0) {
      if (iVar1 < 0) {
        __ptr_00 = nodePages;
        ppiVar3 = lightNodePages;
        if (nodePages != (int **)0x0) goto LAB_00934720;
      }
      else {
        uVar4 = 0;
        do {
          if (ppiVar3[uVar4] != (int *)0x0) {
            free(ppiVar3[uVar4]);
            ppiVar3[uVar4] = (int *)0x0;
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        free(ppiVar3);
        ppiVar3 = lightNodePages;
        nodePages = (int **)0x0;
        if (-1 < iVar1) {
          uVar4 = 0;
          do {
            if (ppiVar3[uVar4] != (int *)0x0) {
              free(ppiVar3[uVar4]);
              ppiVar3[uVar4] = (int *)0x0;
            }
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
          goto LAB_00934749;
        }
      }
    }
    else {
      if (iVar1 < 0) {
        if (nodePages != (int **)0x0) goto LAB_009344f1;
      }
      else {
        uVar4 = 0;
        do {
          __ptr_00[uVar4] = ppiVar3[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
LAB_009344f1:
        free(ppiVar3);
      }
      nodePages = __ptr_00;
      ppiVar3 = (int **)malloc(__size);
      __ptr = lightNodePages;
      if (ppiVar3 != (int **)0x0) {
        iVar2 = iVar1 + 0x81;
        if (iVar1 < 0) {
          if (lightNodePages == (int **)0x0) goto LAB_009345cc;
        }
        else {
          uVar4 = 0;
          do {
            ppiVar3[uVar4] = __ptr[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
        free(__ptr);
        goto LAB_009345cc;
      }
      if (iVar1 < 0) goto LAB_00934720;
      uVar4 = 0;
      do {
        if (__ptr_00[uVar4] != (int *)0x0) {
          free(__ptr_00[uVar4]);
          __ptr_00[uVar4] = (int *)0x0;
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      free(__ptr_00);
      ppiVar3 = lightNodePages;
      nodePages = (int **)0x0;
      if (-1 < iVar1) {
        uVar4 = 0;
        do {
          if (ppiVar3[uVar4] != (int *)0x0) {
            free(ppiVar3[uVar4]);
            ppiVar3[uVar4] = (int *)0x0;
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        goto LAB_00934749;
      }
    }
  }
  else {
LAB_009345cc:
    maxPages = iVar2;
    lightNodePages = ppiVar3;
    currentNodePage = (int *)malloc(0x2000);
    __ptr_00[lVar6 + 1] = currentNodePage;
    if (currentNodePage == (int *)0x0) {
      if (iVar1 < 0) {
LAB_00934720:
        free(__ptr_00);
        nodePages = (int **)0x0;
        ppiVar3 = lightNodePages;
      }
      else {
        uVar4 = 0;
        do {
          if (__ptr_00[uVar4] != (int *)0x0) {
            free(__ptr_00[uVar4]);
            __ptr_00[uVar4] = (int *)0x0;
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        free(__ptr_00);
        ppiVar3 = lightNodePages;
        nodePages = (int **)0x0;
        if (-1 < iVar1) {
          uVar4 = 0;
          do {
            if (ppiVar3[uVar4] != (int *)0x0) {
              free(ppiVar3[uVar4]);
              ppiVar3[uVar4] = (int *)0x0;
            }
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
          goto LAB_00934749;
        }
      }
    }
    else {
      currentLightNodePage = (int *)malloc(0x2000);
      ppiVar3 = lightNodePages;
      lightNodePages[lVar6 + 1] = currentLightNodePage;
      if (currentLightNodePage != (int *)0x0) {
        pageIndex = 0;
        return;
      }
      if (iVar1 < -1) {
        free(__ptr_00);
        nodePages = (int **)0x0;
        goto LAB_00934749;
      }
      uVar4 = 0;
      do {
        if (__ptr_00[uVar4] != (int *)0x0) {
          free(__ptr_00[uVar4]);
          __ptr_00[uVar4] = (int *)0x0;
        }
        uVar4 = uVar4 + 1;
      } while (iVar1 + 2 != uVar4);
      free(__ptr_00);
      nodePages = (int **)0x0;
      if (-1 < iVar1) {
        uVar4 = 0;
        do {
          if (ppiVar3[uVar4] != (int *)0x0) {
            free(ppiVar3[uVar4]);
            ppiVar3[uVar4] = (int *)0x0;
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        goto LAB_00934749;
      }
    }
  }
  if (ppiVar3 == (int **)0x0) {
    memOut = 1;
    return;
  }
LAB_00934749:
  free(ppiVar3);
  lightNodePages = (int **)0x0;
  memOut = 1;
  return;
}

Assistant:

static void
ResizeCountNodePages(void)
{
    int i;
    int **newNodePages;

    page++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. The number of pages is incremented
     * by INITIAL_PAGES.
     */
    if (page == maxPages) {
        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = nodePages[i];
            }
            ABC_FREE(nodePages);
            nodePages = newNodePages;
        }

        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = lightNodePages[i];
            }
            ABC_FREE(lightNodePages);
            lightNodePages = newNodePages;
        }
        /* Increase total page count */
        maxPages += INITIAL_PAGES;
    }
    /* Allocate a new page */
    currentNodePage = nodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentNodePage == NULL) {
        for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* Allocate a new page */
    currentLightNodePage = lightNodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentLightNodePage == NULL) {
        for (i = 0; i <= page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    pageIndex = 0;
    return;

}